

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O0

void __thiscall thread_pool::ThreadPool::ThreadPool(ThreadPool *this,size_t num_threads)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  size_type sVar3;
  reference this_00;
  id local_58;
  type local_50;
  unsigned_long local_40;
  size_t i;
  allocator<thread_pool::ThreadPool::TaskQueue> local_21;
  unsigned_long local_20;
  size_t local_18;
  size_t num_threads_local;
  ThreadPool *this_local;
  
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = num_threads;
  num_threads_local = (size_t)this;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->threads_);
  *(undefined8 *)&(this->thread_map_)._M_h._M_rehash_policy = 0;
  (this->thread_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->thread_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->thread_map_)._M_h._M_element_count = 0;
  (this->thread_map_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->thread_map_)._M_h._M_bucket_count = 0;
  (this->thread_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<std::thread::id,_unsigned_long,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_unsigned_long>_>_>
  ::unordered_map(&this->thread_map_);
  local_20 = 1;
  puVar2 = std::max<unsigned_long>(&local_20,&local_18);
  sVar3 = *puVar2;
  std::allocator<thread_pool::ThreadPool::TaskQueue>::allocator(&local_21);
  std::
  vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>::
  vector(&this->queues_,sVar3,&local_21);
  std::allocator<thread_pool::ThreadPool::TaskQueue>::~allocator(&local_21);
  std::atomic<unsigned_long>::atomic(&this->task_id_,0);
  local_40 = 0;
  while( true ) {
    uVar1 = local_40;
    sVar3 = std::
            vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
            ::size(&this->queues_);
    if (uVar1 == sVar3) break;
    local_50.i = local_40;
    local_50.this = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<thread_pool::ThreadPool::ThreadPool(unsigned_long)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)this,&local_50);
    this_00 = std::vector<std::thread,_std::allocator<std::thread>_>::back(&this->threads_);
    local_58 = std::thread::get_id(this_00);
    std::
    unordered_map<std::thread::id,unsigned_long,std::hash<std::thread::id>,std::equal_to<std::thread::id>,std::allocator<std::pair<std::thread::id_const,unsigned_long>>>
    ::emplace<std::thread::id,unsigned_long&>
              ((unordered_map<std::thread::id,unsigned_long,std::hash<std::thread::id>,std::equal_to<std::thread::id>,std::allocator<std::pair<std::thread::id_const,unsigned_long>>>
                *)&this->thread_map_,&local_58,&local_40);
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

explicit ThreadPool(
      std::size_t num_threads = std::thread::hardware_concurrency())
      : threads_(),
        thread_map_(),
        queues_(std::max(1UL, num_threads)),
        task_id_(0) {
    for (std::size_t i = 0; i != queues_.size(); ++i) {
      threads_.emplace_back([this, i] () -> void { Task(i); });
      thread_map_.emplace(threads_.back().get_id(), i);
    }
  }